

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inline_pass.cpp
# Opt level: O0

void __thiscall
spvtools::opt::InlinePass::MapParams
          (InlinePass *this,Function *calleeFn,iterator *call_inst_itr,
          unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
          *callee2caller)

{
  anon_class_24_3_a204dd1a local_68;
  function<void_(spvtools::opt::Instruction_*)> local_50;
  int local_2c;
  unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  *puStack_28;
  int param_idx;
  unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  *callee2caller_local;
  iterator *call_inst_itr_local;
  Function *calleeFn_local;
  InlinePass *this_local;
  
  local_2c = 0;
  local_68.param_idx = &local_2c;
  local_68.callee2caller = &stack0xffffffffffffffd8;
  local_68.call_inst_itr = call_inst_itr;
  puStack_28 = callee2caller;
  callee2caller_local =
       (unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
        *)call_inst_itr;
  call_inst_itr_local = (iterator *)calleeFn;
  calleeFn_local = (Function *)this;
  std::function<void(spvtools::opt::Instruction*)>::
  function<spvtools::opt::InlinePass::MapParams(spvtools::opt::Function*,spvtools::opt::InstructionList::iterator,std::unordered_map<unsigned_int,unsigned_int,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>*)::__0,void>
            ((function<void(spvtools::opt::Instruction*)> *)&local_50,&local_68);
  opt::Function::ForEachParam(calleeFn,&local_50,false);
  std::function<void_(spvtools::opt::Instruction_*)>::~function(&local_50);
  return;
}

Assistant:

void InlinePass::MapParams(
    Function* calleeFn, BasicBlock::iterator call_inst_itr,
    std::unordered_map<uint32_t, uint32_t>* callee2caller) {
  int param_idx = 0;
  calleeFn->ForEachParam(
      [&call_inst_itr, &param_idx, &callee2caller](const Instruction* cpi) {
        const uint32_t pid = cpi->result_id();
        (*callee2caller)[pid] = call_inst_itr->GetSingleWordOperand(
            kSpvFunctionCallArgumentId + param_idx);
        ++param_idx;
      });
}